

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artitele.cpp
# Opt level: O1

bool __thiscall AArtiTeleport::Use(AArtiTeleport *this,bool pickup)

{
  short sVar1;
  player_t *activator;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  FPlayerStart *pFVar5;
  AActor *pAVar6;
  FSoundID local_3c;
  DAngle local_38;
  DVector3 local_30;
  
  uVar2 = deathmatchstarts.Count;
  if (deathmatch.Value == 0) {
    pFVar5 = G_PickPlayerStart((int)((ulong)(((this->super_AInventory).Owner.field_0.p)->player
                                             [-0x3e51].weapons.Slots + 3) >> 5) * 0x3cf3cf3d,0);
  }
  else {
    uVar4 = FRandom::GenRand32(&pr_tele);
    pFVar5 = (FPlayerStart *)
             ((long)&((deathmatchstarts.Array)->pos).X + (ulong)((uVar4 & 0xff) % uVar2 << 5));
  }
  local_30.X = (pFVar5->pos).X;
  local_30.Y = (pFVar5->pos).Y;
  sVar1 = pFVar5->angle;
  pAVar6 = (this->super_AInventory).Owner.field_0.p;
  if ((pAVar6 != (AActor *)0x0) &&
     (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->super_AInventory).Owner.field_0.p = (AActor *)0x0;
    pAVar6 = (AActor *)0x0;
  }
  local_30.Z = -2147483648.0;
  local_38.Degrees = (double)(int)sVar1;
  P_Teleport(pAVar6,&local_30,&local_38,3);
  if ((((((this->super_AInventory).Owner.field_0.p)->player->morphTics != 0) &&
       ((((this->super_AInventory).Owner.field_0.p)->player->MorphStyle & 8) != 0)) &&
      (activator = ((this->super_AInventory).Owner.field_0.p)->player,
      bVar3 = P_UndoPlayerMorph(activator,activator,8,false), !bVar3)) &&
     ((((this->super_AInventory).Owner.field_0.p)->player->MorphStyle & 0x20) != 0)) {
    return true;
  }
  pAVar6 = (this->super_AInventory).Owner.field_0.p;
  if ((pAVar6 != (AActor *)0x0) &&
     (((pAVar6->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
    (this->super_AInventory).Owner.field_0.p = (AActor *)0x0;
    pAVar6 = (AActor *)0x0;
  }
  local_3c.ID = S_FindSound("*evillaugh");
  S_Sound(pAVar6,2,&local_3c,1.0,0.0);
  return true;
}

Assistant:

bool AArtiTeleport::Use (bool pickup)
{
	DVector3 dest;
	int destAngle;

	if (deathmatch)
	{
		unsigned int selections = deathmatchstarts.Size ();
		unsigned int i = pr_tele() % selections;
		dest = deathmatchstarts[i].pos;
		destAngle = deathmatchstarts[i].angle;
	}
	else
	{
		FPlayerStart *start = G_PickPlayerStart(int(Owner->player - players));
		dest = start->pos;
		destAngle = start->angle;
	}
	dest.Z = ONFLOORZ;
	P_Teleport (Owner, dest, (double)destAngle, TELF_SOURCEFOG | TELF_DESTFOG);
	bool canlaugh = true;
 	if (Owner->player->morphTics && (Owner->player->MorphStyle & MORPH_UNDOBYCHAOSDEVICE))
 	{ // Teleporting away will undo any morph effects (pig)
		if (!P_UndoPlayerMorph (Owner->player, Owner->player, MORPH_UNDOBYCHAOSDEVICE)
			&& (Owner->player->MorphStyle & MORPH_FAILNOLAUGH))
		{
			canlaugh = false;
		}
 	}
	if (canlaugh)
 	{ // Full volume laugh
 		S_Sound (Owner, CHAN_VOICE, "*evillaugh", 1, ATTN_NONE);
 	}
	return true;
}